

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::Session::run(Session *this)

{
  type tVar1;
  unsigned_long *puVar2;
  long in_RDI;
  Config *in_stack_00000008;
  exception *ex;
  IConfig *in_stack_00000050;
  Option<unsigned_long> listed;
  Ptr<Catch::Config> *in_stack_00000360;
  Session *in_stack_ffffffffffffff60;
  int local_60;
  Option<unsigned_long> local_30 [2];
  int local_4;
  
  if ((*(byte *)(in_RDI + 0x87) & 1) == 0) {
    config(in_stack_ffffffffffffff60);
    Ptr<Catch::Config>::operator*((Ptr<Catch::Config> *)(in_RDI + 0x138));
    seedRng((IConfig *)0x1b62b3);
    if ((*(byte *)(in_RDI + 0x89) & 1) != 0) {
      Ptr<Catch::Config>::operator*((Ptr<Catch::Config> *)(in_RDI + 0x138));
      applyFilenamesAsTags(in_stack_00000050);
    }
    config(in_stack_ffffffffffffff60);
    list(in_stack_00000008);
    tVar1 = Option::operator_cast_to_function_pointer((Option<unsigned_long> *)0x1b6334);
    if (tVar1 != 0) {
      puVar2 = Option<unsigned_long>::operator*(local_30);
      local_4 = (int)*puVar2;
    }
    Option<unsigned_long>::~Option((Option<unsigned_long> *)0x1b6439);
    if (tVar1 == 0) {
      runTests(in_stack_00000360);
      local_4 = local_60;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int run() {
            if( m_configData.showHelp )
                return 0;

            try
            {
                config(); // Force config to be constructed

                seedRng( *m_config );

                if( m_configData.filenamesAsTags )
                    applyFilenamesAsTags( *m_config );

                // Handle list request
                if( Option<std::size_t> listed = list( config() ) )
                    return static_cast<int>( *listed );

                return static_cast<int>( runTests( m_config ).assertions.failed );
            }
            catch( std::exception& ex ) {
                Catch::cerr() << ex.what() << std::endl;
                return (std::numeric_limits<int>::max)();
            }
        }